

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

char * GetFileNameWithoutExt(char *filePath)

{
  char *__src;
  size_t sVar1;
  int local_18;
  int i;
  int len;
  char *filePath_local;
  
  memset(GetFileNameWithoutExt::fileName,0,0x80);
  if (filePath != (char *)0x0) {
    __src = GetFileName(filePath);
    strcpy(GetFileNameWithoutExt::fileName,__src);
  }
  sVar1 = strlen(GetFileNameWithoutExt::fileName);
  local_18 = 0;
  do {
    if ((int)sVar1 <= local_18 || 0x7f < local_18) {
LAB_0012fb59:
      return GetFileNameWithoutExt::fileName;
    }
    if (GetFileNameWithoutExt::fileName[local_18] == '.') {
      GetFileNameWithoutExt::fileName[local_18] = '\0';
      goto LAB_0012fb59;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

const char *GetFileNameWithoutExt(const char *filePath)
{
    #define MAX_FILENAMEWITHOUTEXT_LENGTH   128

    static char fileName[MAX_FILENAMEWITHOUTEXT_LENGTH];
    memset(fileName, 0, MAX_FILENAMEWITHOUTEXT_LENGTH);

    if (filePath != NULL) strcpy(fileName, GetFileName(filePath));   // Get filename with extension

    int len = (int)strlen(fileName);

    for (int i = 0; (i < len) && (i < MAX_FILENAMEWITHOUTEXT_LENGTH); i++)
    {
        if (fileName[i] == '.')
        {
            // NOTE: We break on first '.' found
            fileName[i] = '\0';
            break;
        }
    }

    return fileName;
}